

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Configure(cmake *this)

{
  cmState *pcVar1;
  cmMessenger *pcVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  bool local_349;
  bool local_2e1;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  char *local_1e0;
  char *delCacheVars;
  int ret;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  char *local_138;
  char *value;
  key_type local_128;
  allocator<char> local_101;
  string local_100;
  char *local_e0;
  char *cachedErrorDeprecated;
  string local_d0;
  char *local_b0;
  char *cachedWarnDeprecated;
  undefined1 local_a0 [6];
  bool setDeprecatedVariables;
  allocator<char> local_79;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  mapped_type local_1c;
  cmake *pcStack_18;
  DiagLevel diagLevel;
  cmake *this_local;
  
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"deprecated",&local_41);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar4 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"deprecated",&local_79);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,&local_78);
    local_1c = *pmVar5;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (local_1c == DIAG_IGNORE) {
      SetSuppressDeprecatedWarnings(this,true);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_1c == DIAG_WARN) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_1c == DIAG_ERROR) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,true);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"dev",(allocator<char> *)((long)&cachedWarnDeprecated + 7));
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,(key_type *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cachedWarnDeprecated + 7));
  if (sVar4 == 1) {
    cachedWarnDeprecated._6_1_ = 0;
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_WARN_DEPRECATED",
               (allocator<char> *)((long)&cachedErrorDeprecated + 7));
    pcVar6 = cmState::GetCacheEntryValue(pcVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cachedErrorDeprecated + 7));
    pcVar1 = this->State;
    local_b0 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CMAKE_ERROR_DEPRECATED",&local_101);
    pcVar6 = cmState::GetCacheEntryValue(pcVar1,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    if ((local_b0 == (char *)0x0) && (pcVar6 == (char *)0x0)) {
      cachedWarnDeprecated._6_1_ = 1;
    }
    local_e0 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"dev",(allocator<char> *)((long)&value + 7));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,&local_128);
    local_1c = *pmVar5;
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    if (local_1c == DIAG_IGNORE) {
      SetSuppressDevWarnings(this,true);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,true);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_1c == DIAG_WARN) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_1c == DIAG_ERROR) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,true);
      if ((cachedWarnDeprecated._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,true);
      }
    }
  }
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CMAKE_WARN_DEPRECATED",&local_159);
  pcVar6 = cmState::GetCacheEntryValue(pcVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pcVar2 = this->Messenger;
  local_2e1 = false;
  local_138 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    local_2e1 = cmSystemTools::IsOff(pcVar6);
  }
  cmMessenger::SetSuppressDeprecatedWarnings(pcVar2,local_2e1);
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"CMAKE_ERROR_DEPRECATED",&local_181);
  local_138 = cmState::GetCacheEntryValue(pcVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pcVar2 = this->Messenger;
  bVar3 = cmSystemTools::IsOn(local_138);
  cmMessenger::SetDeprecatedWarningsAsErrors(pcVar2,bVar3);
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_1a9);
  local_138 = cmState::GetCacheEntryValue(pcVar1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pcVar2 = this->Messenger;
  bVar3 = cmSystemTools::IsOn(local_138);
  cmMessenger::SetSuppressDevWarnings(pcVar2,bVar3);
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",
             (allocator<char> *)((long)&delCacheVars + 7));
  local_138 = cmState::GetCacheEntryValue(pcVar1,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator((allocator<char> *)((long)&delCacheVars + 7));
  pcVar2 = this->Messenger;
  local_349 = false;
  if (local_138 != (char *)0x0) {
    local_349 = cmSystemTools::IsOff(local_138);
  }
  cmMessenger::SetDevWarningsAsErrors(pcVar2,local_349);
  delCacheVars._0_4_ = ActualConfigure(this);
  pcVar1 = this->State;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_201);
  pcVar6 = cmState::GetGlobalProperty(pcVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    this_local._4_4_ = (int)delCacheVars;
  }
  else {
    local_1e0 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar6,&local_229);
    this_local._4_4_ = HandleDeleteCacheVariables(this,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Configure()
{
  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    const char* cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    const char* cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  const char* value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value &&
                                                 cmSystemTools::IsOff(value));

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(cmSystemTools::IsOn(value));

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value &&
                                          cmSystemTools::IsOff(value));

  int ret = this->ActualConfigure();
  const char* delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && delCacheVars[0] != 0) {
    return this->HandleDeleteCacheVariables(delCacheVars);
  }
  return ret;
}